

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseCatchExprList(WastParser *this,CatchVector *catches)

{
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  bool local_141;
  undefined1 local_108 [8];
  Token token;
  undefined1 local_a8 [8];
  Catch catch_;
  bool parsedCatchAll;
  CatchVector *catches_local;
  WastParser *this_local;
  
  catch_.exprs.size_._7_1_ = 0;
  do {
    GetLocation((Location *)&token.field_2.literal_.text._M_str,this);
    Catch::Catch((Catch *)local_a8,(Location *)&token.field_2.literal_.text._M_str);
    Consume((Token *)local_108,this);
    TVar2 = Token::token_type((Token *)local_108);
    if (TVar2 == Catch) {
      RVar3 = ParseVar(this,(Var *)((long)&catch_.loc.field_1 + 8));
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        bVar1 = true;
      }
      else {
LAB_0028bff3:
        RVar3 = ParseTerminatingInstrList(this,(ExprList *)((long)&catch_.var.field_2 + 0x18));
        bVar1 = Failed(RVar3);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          RVar3 = Expect(this,Rpar);
          bVar1 = Failed(RVar3);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::push_back
                      (catches,(value_type *)local_a8);
            bVar1 = false;
          }
        }
      }
    }
    else {
      if ((catch_.exprs.size_._7_1_ & 1) == 0) {
        catch_.exprs.size_._7_1_ = 1;
        goto LAB_0028bff3;
      }
      Error(this,0x35d824);
      Result::Result((Result *)((long)&this_local + 4),Error);
      bVar1 = true;
    }
    Catch::~Catch((Catch *)local_a8);
    if (bVar1) {
      return (Result)this_local._4_4_;
    }
    bVar1 = Match(this,Lpar);
    local_141 = false;
    if (bVar1) {
      TVar2 = Peek(this,0);
      local_141 = anon_unknown_1::IsCatch(TVar2);
    }
    if (local_141 == false) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseCatchExprList(CatchVector* catches) {
  WABT_TRACE(ParseCatchExprList);
  bool parsedCatchAll = false;

  do {
    Catch catch_(GetLocation());

    auto token = Consume();
    if (token.token_type() == TokenType::Catch) {
      CHECK_RESULT(ParseVar(&catch_.var));
    } else {
      if (parsedCatchAll) {
        Error(token.loc, "multiple catch_all clauses not allowed");
        return Result::Error;
      }
      parsedCatchAll = true;
    }

    CHECK_RESULT(ParseTerminatingInstrList(&catch_.exprs));
    EXPECT(Rpar);
    catches->push_back(std::move(catch_));
  } while (Match(TokenType::Lpar) && IsCatch(Peek()));

  return Result::Ok;
}